

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O2

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  spdlog_ex *psVar2;
  int *piVar3;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  stat64 st;
  
  if (f == (FILE *)0x0) {
    psVar2 = (spdlog_ex *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Failed getting file size. fd is null",(allocator<char> *)&st);
    spdlog_ex::spdlog_ex(psVar2,&local_c8);
    __cxa_throw(psVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  iVar1 = fileno((FILE *)f);
  iVar1 = fstat64(iVar1,(stat64 *)&st);
  if (iVar1 == 0) {
    return st.st_size;
  }
  psVar2 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Failed getting file size from fd",&local_e9);
  piVar3 = __errno_location();
  spdlog_ex::spdlog_ex(psVar2,&local_e8,*piVar3);
  __cxa_throw(psVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

inline size_t filesize(FILE *f)
{
    if (f == nullptr)
    {
        throw spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = _fileno(f);
#if _WIN64 // 64 bits
    __int64 ret = _filelengthi64(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }

#else // windows 32 bits
    long ret = _filelength(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }
#endif

#else // unix
    int fd = fileno(f);
// 64 bits(but not in osx or cygwin, where fstat64 is deprecated)
#if !defined(__FreeBSD__) && !defined(__APPLE__) && (defined(__x86_64__) || defined(__ppc64__)) && !defined(__CYGWIN__)
    struct stat64 st;
    if (fstat64(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#else // unix 32 bits or cygwin
    struct stat st;

    if (fstat(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#endif
#endif
    throw spdlog_ex("Failed getting file size from fd", errno);
}